

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1ResolutionChange_InvalidRefSize_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AV1ResolutionChange_InvalidRefSize_Test>
           *this)

{
  AV1ResolutionChange *this_00;
  
  WithParamInterface<std::tuple<int,aom_rc_mode,int>>::parameter_ = &this->parameter_;
  this_00 = (AV1ResolutionChange *)operator_new(0x28);
  anon_unknown.dwarf_11f98de::AV1ResolutionChange::AV1ResolutionChange(this_00);
  (this_00->super_TestWithParam<std::tuple<int,_aom_rc_mode,_int>_>).super_Test._vptr_Test =
       (_func_int **)&PTR__TestWithParam_00f30d80;
  (this_00->super_TestWithParam<std::tuple<int,_aom_rc_mode,_int>_>).
  super_WithParamInterface<std::tuple<int,_aom_rc_mode,_int>_>._vptr_WithParamInterface =
       (_func_int **)&DAT_00f30dc0;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }